

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O2

string * getAttribute(string *__return_storage_ptr__,string *source,string *attrName)

{
  string attr_namefull;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,attrName,"=\"");
  std::__cxx11::string::find((string *)source,(ulong)&local_40);
  std::__cxx11::string::find((char *)source,0x3a470c);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)source);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string getAttribute(const std::string &source, const std::string &attrName) {
	std::string attr_namefull = attrName + "=\"";
	std::size_t startpos = source.find(attr_namefull) + attr_namefull.size();
	std::size_t endpos = source.find("\"", startpos);
	return source.substr(startpos, endpos - startpos);
}